

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void charls::transform_triplet_to_line<charls::transform_hp3<unsigned_short>,unsigned_short>
               (triplet<unsigned_short> *source,size_t pixel_stride_in,unsigned_short *destination,
               size_t pixel_stride,transform_hp3<unsigned_short> *transform,uint32_t mask)

{
  uint uVar1;
  uint uVar2;
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *paVar3;
  size_t sVar4;
  uint uVar5;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  if (pixel_stride_in != 0) {
    paVar3 = &source->field_2;
    sVar4 = 0;
    do {
      uVar5 = ((anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 *)(paVar3 + -1))->v2 & mask;
      uVar2 = (paVar3->v3 & mask) - uVar5 ^ 0x8000;
      uVar1 = ((((triplet<unsigned_short> *)(paVar3 + -2))->field_0).v1 & mask) - uVar5 ^ 0x8000;
      destination[sVar4] = (short)uVar5 + (short)((uVar1 & 0xffff) + (uVar2 & 0xffff) >> 2) + 0xc000
      ;
      destination[pixel_stride + sVar4] = (unsigned_short)uVar2;
      destination[pixel_stride * 2 + sVar4] = (unsigned_short)uVar1;
      sVar4 = sVar4 + 1;
      paVar3 = paVar3 + 3;
    } while (pixel_stride_in != sVar4);
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}